

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O0

void WavParserHelper::PrintDataType(WavDataType DataType)

{
  ostream *poVar1;
  WavDataType DataType_local;
  
  switch(DataType) {
  case WavData8bit:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : uint 8bit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case WavData12bit:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : int 12bit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case WavData16bit:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : int 16bit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case WavData24bit:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : int 24bit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case WavData32bit:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : float 32bit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case WavData64bit:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : double 64bit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"WavData : Invalid");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void WavParserHelper::PrintDataType(WavDataType DataType)
{
	switch (DataType)
	{
	case WavDataType::WavData8bit:
		std::cout << "WavData : uint 8bit" << std::endl;
		break;
	case WavDataType::WavData12bit:
		std::cout << "WavData : int 12bit" << std::endl;
		break;
	case WavDataType::WavData16bit:
		std::cout << "WavData : int 16bit" << std::endl;
		break;
	case WavDataType::WavData24bit:
		std::cout << "WavData : int 24bit" << std::endl;
		break;
	case WavDataType::WavData32bit:
		std::cout << "WavData : float 32bit" << std::endl;
		break;
	case WavDataType::WavData64bit:
		std::cout << "WavData : double 64bit" << std::endl;
		break;
	default:
		std::cout << "WavData : Invalid" << std::endl;
	}

	return;
}